

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O1

int write_dword(FILE *fp,uint32_t v)

{
  size_t sVar1;
  uint8_t b [4];
  undefined1 local_4 [4];
  
  sVar1 = fwrite(local_4,1,4,(FILE *)fp);
  return (int)sVar1;
}

Assistant:

int write_dword(FILE* fp, uint32_t v)
{
    uint8_t b[4];

    b[0] = v & 0xff;
    b[1] = (v >> 8) & 0xff;
    b[2] = (v >> 16) & 0xff;
    b[3] = (v >> 24) & 0xff;

    return fwrite(b, 1, 4, fp);
}